

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame)

{
  ZSTD_compressedBlockState_t *pZVar1;
  int iVar2;
  size_t sVar3;
  size_t err_code;
  int bmi2;
  
  bmi2 = 0x77eba3;
  sVar3 = ZSTD_buildSeqStore(zc,src,srcSize);
  iVar2 = 1;
  if (sVar3 < 0xffffffffffffff89) {
    iVar2 = (uint)(sVar3 == 1) << 2;
  }
  if (iVar2 == 4) {
    sVar3 = 0;
  }
  else {
    if (iVar2 != 0) {
      return sVar3;
    }
    if ((zc->seqCollector).collectSequences != 0) {
      ZSTD_copyBlockSequences(zc);
      pZVar1 = (zc->blockState).prevCBlock;
      (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
      (zc->blockState).nextCBlock = pZVar1;
      return 0;
    }
    sVar3 = ZSTD_entropyCompressSeqStore
                      (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                       &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,dst,dstCapacity,
                       srcSize,zc->entropyWorkspace,(ulong)(uint)zc->bmi2,bmi2);
    if ((((frame != 0) && (zc->isFirstBlock == 0)) && (sVar3 < 0x19)) &&
       (iVar2 = ZSTD_isRLE((BYTE *)src,srcSize), iVar2 != 0)) {
      *(undefined1 *)dst = *src;
      sVar3 = 1;
    }
  }
  if (sVar3 - 2 < 0xffffffffffffff87) {
    pZVar1 = (zc->blockState).prevCBlock;
    (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
    (zc->blockState).nextCBlock = pZVar1;
  }
  pZVar1 = (zc->blockState).prevCBlock;
  if ((pZVar1->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (pZVar1->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return sVar3;
}

Assistant:

static size_t
ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                            void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize, U32 frame)
{
    /* This is an estimated upper bound for the length of an rle block.
     * This isn't the actual upper bound.
     * Finding the real threshold needs further investigation.
     */
    const U32 rleMaxLength = 25;
    size_t cSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit,
                (unsigned)zc->blockState.matchState.nextToUpdate);

    {   const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
        FORWARD_IF_ERROR(bss, "ZSTD_buildSeqStore failed");
        if (bss == ZSTDbss_noCompress) { cSize = 0; goto out; }
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    /* encode sequences and literals */
    cSize = ZSTD_entropyCompressSeqStore(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

    if (frame &&
        /* We don't want to emit our first block as a RLE even if it qualifies because
         * doing so will cause the decoder (cli only) to throw a "should consume all input error."
         * This is only an issue for zstd <= v1.4.3
         */
        !zc->isFirstBlock &&
        cSize < rleMaxLength &&
        ZSTD_isRLE(ip, srcSize))
    {
        cSize = 1;
        op[0] = ip[0];
    }

out:
    if (!ZSTD_isError(cSize) && cSize > 1) {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}